

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuild_gl.cpp
# Opt level: O1

DWORD __thiscall FNodeBuilder::CheckLoopEnd(FNodeBuilder *this,fixed_t dx,fixed_t dy,int vertex)

{
  FPrivVert *pFVar1;
  FPrivVert *pFVar2;
  FPrivSeg *pFVar3;
  bool bVar4;
  angle_t aVar5;
  angle_t aVar6;
  uint uVar7;
  uint uVar8;
  DWORD DVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double d_dx;
  double l;
  double d_dy;
  DWORD local_50;
  
  pFVar2 = (this->Vertices).Array;
  pFVar1 = pFVar2 + vertex;
  aVar5 = PointToAngle(dx,dy);
  DVar9 = pFVar2[vertex].segs;
  local_50 = 0xffffffff;
  uVar8 = 0xffffffff;
  if (DVar9 != 0xffffffff) {
    dVar10 = (double)dx;
    dVar12 = (double)dy;
    local_50 = 0xffffffff;
    do {
      pFVar2 = (this->Vertices).Array;
      pFVar3 = (this->Segs).Array + DVar9;
      aVar6 = PointToAngle(pFVar2[pFVar3->v2].super_FSimpleVert.x - (pFVar1->super_FSimpleVert).x,
                           pFVar2[pFVar3->v2].super_FSimpleVert.y - (pFVar1->super_FSimpleVert).y);
      uVar7 = aVar6 - (aVar5 + 0x80000000);
      if (uVar7 < 5000) {
        pFVar2 = (this->Vertices).Array;
        dVar11 = ((double)(pFVar1->super_FSimpleVert).y -
                 (double)pFVar2[pFVar3->v1].super_FSimpleVert.y) * dVar10 -
                 ((double)(pFVar1->super_FSimpleVert).x -
                 (double)pFVar2[pFVar3->v1].super_FSimpleVert.x) * dVar12;
        if ((17179869184.0 <= ABS(dVar11)) ||
           (bVar4 = true, 42.94967296 <= (dVar11 * dVar11) / (dVar12 * dVar12 + dVar10 * dVar10))) {
          bVar4 = false;
        }
        if (!bVar4) goto LAB_003a893c;
      }
      else {
LAB_003a893c:
        if (uVar7 <= uVar8) {
          uVar8 = uVar7;
          local_50 = DVar9;
        }
      }
      DVar9 = pFVar3->nextforvert;
    } while (DVar9 != 0xffffffff);
  }
  if (local_50 == 0xffffffff) {
LAB_003a89b9:
    local_50 = 0xffffffff;
  }
  else {
    for (DVar9 = pFVar1->segs2; DVar9 != 0xffffffff; DVar9 = pFVar3[DVar9].nextforvert2) {
      pFVar3 = (this->Segs).Array;
      pFVar2 = (this->Vertices).Array;
      aVar6 = PointToAngle(pFVar2[pFVar3[DVar9].v1].super_FSimpleVert.x -
                           (pFVar1->super_FSimpleVert).x,
                           pFVar2[pFVar3[DVar9].v1].super_FSimpleVert.y -
                           (pFVar1->super_FSimpleVert).y);
      if (pFVar3[DVar9].partner != local_50 && aVar6 - (aVar5 + 0x80000000) < uVar8)
      goto LAB_003a89b9;
    }
  }
  return local_50;
}

Assistant:

DWORD FNodeBuilder::CheckLoopEnd (fixed_t dx, fixed_t dy, int vertex)
{
	FPrivVert *v = &Vertices[vertex];
	angle_t splitAngle = PointToAngle (dx, dy) + ANGLE_180;
	DWORD segnum;
	angle_t bestang;
	DWORD bestseg;

	// Find the seg starting at this vertex that forms the smallest angle
	// to the splitter.
	segnum = v->segs;
	bestang = ANGLE_MAX;
	bestseg = DWORD_MAX;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		angle_t segAngle = PointToAngle (Vertices[seg->v2].x - v->x, Vertices[seg->v2].y - v->y);
		angle_t diff = segAngle - splitAngle;

		if (diff < ANGLE_EPSILON &&
			PointOnSide (Vertices[seg->v1].x, Vertices[seg->v1].y, v->x, v->y, dx, dy) == 0)
		{
			// If a seg lies right on the splitter, don't count it
		}
		else
		{
			if (diff <= bestang)
			{
				bestang = diff;
				bestseg = segnum;
			}
		}
		segnum = seg->nextforvert;
	}
	if (bestseg == DWORD_MAX)
	{
		return DWORD_MAX;
	}
	// Now make sure there are no segs ending at this vertex that form
	// an even smaller angle to the splitter.
	segnum = v->segs2;
	while (segnum != DWORD_MAX)
	{
		FPrivSeg *seg = &Segs[segnum];
		angle_t segAngle = PointToAngle (Vertices[seg->v1].x - v->x, Vertices[seg->v1].y - v->y);
		angle_t diff = segAngle - splitAngle;
		if (diff < bestang && seg->partner != bestseg)
		{
			return DWORD_MAX;
		}
		segnum = seg->nextforvert2;
	}
	return bestseg;
}